

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayInit<wasm::ArrayInitElem>
          (InternalAnalyzer *this,ArrayInitElem *curr)

{
  bool bVar1;
  ArrayInitElem *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x20) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->writesArray = true;
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayInit(ArrayInit* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesArray = true;
      // Traps when the destination is null, when out of bounds in source or
      // destination, or when the source segment has been dropped.
      parent.implicitTrap = true;
    }